

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_map.hpp
# Opt level: O3

void __thiscall
cappuccino::
ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>
::do_insert(ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,bool *value
           ,time_point expire_time)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::keyed_element>_>,_bool>
  pVar3;
  keyed_element element;
  keyed_element local_30;
  
  local_30.m_ttl_position._M_node = (_List_node_base *)0x0;
  local_30.m_value = *value;
  pVar3 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::keyed_element>,std::_Select1st<std::pair<std::__cxx11::string_const,cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::keyed_element>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::keyed_element>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::keyed_element>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::keyed_element>,std::_Select1st<std::pair<std::__cxx11::string_const,cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::keyed_element>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::keyed_element>>>
                      *)&this->m_keyed_elements,key,&local_30);
  p_Var2 = (_List_node_base *)operator_new(0x20);
  p_Var2[1]._M_next = (_List_node_base *)expire_time.__d.__r;
  p_Var2[1]._M_prev = (_List_node_base *)pVar3.first._M_node._M_node;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->m_ttl_list).
            super__List_base<cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::ttl_element>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  pVar3.first._M_node._M_node[2]._M_parent =
       (_Base_ptr)
       (this->m_ttl_list).
       super__List_base<cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::ttl_element>_>
       ._M_impl._M_node.super__List_node_base._M_prev;
  return;
}

Assistant:

auto do_insert(const key_type& key, value_type&& value, std::chrono::steady_clock::time_point expire_time) -> void
    {
        keyed_element element;
        element.m_value = std::move(value);

        auto keyed_position = m_keyed_elements.emplace(key, std::move(element)).first;

        m_ttl_list.emplace_back(expire_time, keyed_position);

        // Update the elements iterator to ttl_element.
        keyed_position->second.m_ttl_position = std::prev(m_ttl_list.end());
    }